

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O1

void UTF_fgets_test(char *fname)

{
  char16_t cVar1;
  long lVar2;
  UTF_UC8 UVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  size_t sVar6;
  char16_t *pcVar7;
  char *pcVar8;
  char16_t *pcVar9;
  long lVar10;
  char16_t *pcVar11;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  bool bVar17;
  bool bVar18;
  UTF_C8 buf2 [128];
  char16_t local_128 [63];
  char16_t local_aa;
  UTF_UC8 local_a8;
  UTF_UC8 aUStack_a7 [127];
  char16_t *pcVar12;
  char16_t *pcVar13;
  
  pcVar9 = local_128;
  pcVar11 = local_128;
  pcVar12 = local_128;
  pcVar13 = local_128;
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    UTF_test(0x5a,false);
    return;
  }
  iVar4 = feof(__stream);
  if (iVar4 == 0) {
    sVar6 = fread(local_128,2,0x40,__stream);
    if (sVar6 == 0) goto LAB_00102580;
    sVar15 = 1;
    do {
      if (local_128[sVar15 - 1] == L'\n') {
        if ((sVar15 == 1) || (local_128[sVar15 - 2] != L'\r')) {
          if (sVar15 == 0x40) {
            sVar15 = sVar15 - 1;
          }
          local_128[sVar15] = L'\0';
          sVar16 = sVar15;
        }
        else {
          (local_128 + (sVar15 - 2))[0] = L'\n';
          (local_128 + (sVar15 - 2))[1] = L'\0';
          sVar16 = sVar15;
        }
        break;
      }
      bVar17 = sVar15 != sVar6;
      sVar16 = sVar6;
      sVar15 = sVar15 + 1;
    } while (bVar17);
    if (sVar16 == 0x40) {
      sVar16 = 0x3f;
LAB_00102c0e:
      local_128[sVar16] = L'\0';
    }
    else if (sVar16 == sVar6) goto LAB_00102c0e;
    if (sVar16 - sVar6 != 0) {
      iVar4 = fseek(__stream,(sVar16 - sVar6) * 2,1);
      if (iVar4 != 0) goto LAB_00102580;
    }
    pcVar7 = (char16_t *)(undefined1 *)0x0;
    if (local_128[0] != L'\0') {
      pcVar7 = local_128;
    }
  }
  else {
LAB_00102580:
    pcVar7 = (char16_t *)(undefined1 *)0x0;
  }
  UTF_test(0x5e,pcVar7 == local_128);
  pcVar7 = L"TEST\n";
  cVar1 = local_128[0];
  while (cVar1 != L'\0') {
    pcVar9 = pcVar9 + 1;
    if (*pcVar7 == L'\0') {
      pcVar7 = L"";
      break;
    }
    if (cVar1 != *pcVar7) {
      bVar17 = false;
      goto LAB_00102651;
    }
    pcVar7 = pcVar7 + 1;
    cVar1 = *pcVar9;
  }
  bVar17 = cVar1 == *pcVar7;
LAB_00102651:
  UTF_test(0x5f,bVar17);
  if (local_128[0] == L'\0') {
    sVar14 = 1;
  }
  else {
    sVar5 = 1;
    do {
      sVar14 = sVar5 + 1;
      pcVar9 = local_128 + sVar5;
      sVar5 = sVar14;
    } while (*pcVar9 != L'\0');
  }
  UTF_uj16_to_uj8(local_128,sVar14,&local_a8,0x80);
  UVar3 = local_a8;
  if (local_a8 == '\0') {
    pcVar8 = "TEST\n";
  }
  else {
    pcVar8 = "";
    lVar2 = 0;
    do {
      lVar10 = lVar2;
      if (lVar10 == 5) goto LAB_001026d9;
      if (UVar3 != "TEST\n"[lVar10]) {
        bVar17 = false;
        goto LAB_001026e2;
      }
      UVar3 = aUStack_a7[lVar10];
      lVar2 = lVar10 + 1;
    } while (UVar3 != '\0');
    pcVar8 = "TEST\n" + lVar10 + 1;
  }
LAB_001026d9:
  bVar17 = UVar3 == *pcVar8;
LAB_001026e2:
  UTF_test(0x61,bVar17);
  iVar4 = feof(__stream);
  if (iVar4 == 0) {
    sVar6 = fread(local_128,2,0x40,__stream);
    if (sVar6 == 0) goto LAB_001026fb;
    sVar15 = 1;
    do {
      if (local_128[sVar15 - 1] == L'\n') {
        if ((sVar15 == 1) || (local_128[sVar15 - 2] != L'\r')) {
          if (sVar15 == 0x40) {
            sVar15 = sVar15 - 1;
          }
          local_128[sVar15] = L'\0';
          sVar16 = sVar15;
        }
        else {
          (local_128 + (sVar15 - 2))[0] = L'\n';
          (local_128 + (sVar15 - 2))[1] = L'\0';
          sVar16 = sVar15;
        }
        break;
      }
      bVar17 = sVar15 != sVar6;
      sVar16 = sVar6;
      sVar15 = sVar15 + 1;
    } while (bVar17);
    if (sVar16 == 0x40) {
      sVar16 = 0x3f;
LAB_00102c63:
      local_128[sVar16] = L'\0';
    }
    else if (sVar16 == sVar6) goto LAB_00102c63;
    if (sVar16 - sVar6 != 0) {
      iVar4 = fseek(__stream,(sVar16 - sVar6) * 2,1);
      if (iVar4 != 0) goto LAB_001026fb;
    }
    pcVar9 = (char16_t *)(undefined1 *)0x0;
    if (local_128[0] != L'\0') {
      pcVar9 = local_128;
    }
  }
  else {
LAB_001026fb:
    pcVar9 = (char16_t *)(undefined1 *)0x0;
  }
  UTF_test(99,pcVar9 == local_128);
  pcVar9 = L"ABC123\n";
  cVar1 = local_128[0];
  while (cVar1 != L'\0') {
    pcVar11 = pcVar11 + 1;
    if (*pcVar9 == L'\0') {
      pcVar9 = L"";
      break;
    }
    if (cVar1 != *pcVar9) {
      bVar17 = false;
      goto LAB_001027a1;
    }
    pcVar9 = pcVar9 + 1;
    cVar1 = *pcVar11;
  }
  bVar17 = cVar1 == *pcVar9;
LAB_001027a1:
  UTF_test(100,bVar17);
  if (local_128[0] == L'\0') {
    sVar14 = 1;
  }
  else {
    sVar5 = 1;
    do {
      sVar14 = sVar5 + 1;
      pcVar9 = local_128 + sVar5;
      sVar5 = sVar14;
    } while (*pcVar9 != L'\0');
  }
  UTF_uj16_to_uj8(local_128,sVar14,&local_a8,0x80);
  UVar3 = local_a8;
  if (local_a8 == '\0') {
    pcVar8 = "ABC123\n";
  }
  else {
    pcVar8 = "";
    lVar2 = 0;
    do {
      lVar10 = lVar2;
      if (lVar10 == 7) goto LAB_00102829;
      if (UVar3 != "ABC123\n"[lVar10]) {
        bVar17 = false;
        goto LAB_00102832;
      }
      UVar3 = aUStack_a7[lVar10];
      lVar2 = lVar10 + 1;
    } while (UVar3 != '\0');
    pcVar8 = "ABC123\n" + lVar10 + 1;
  }
LAB_00102829:
  bVar17 = UVar3 == *pcVar8;
LAB_00102832:
  UTF_test(0x66,bVar17);
  iVar4 = feof(__stream);
  if (iVar4 == 0) {
    sVar6 = fread(local_128,2,0x40,__stream);
    if (sVar6 == 0) goto LAB_0010284b;
    sVar15 = 1;
    do {
      if (local_128[sVar15 - 1] == L'\n') {
        if ((sVar15 == 1) || (local_128[sVar15 - 2] != L'\r')) {
          if (sVar15 == 0x40) {
            sVar15 = sVar15 - 1;
          }
          local_128[sVar15] = L'\0';
          sVar16 = sVar15;
        }
        else {
          (local_128 + (sVar15 - 2))[0] = L'\n';
          (local_128 + (sVar15 - 2))[1] = L'\0';
          sVar16 = sVar15;
        }
        break;
      }
      bVar17 = sVar15 != sVar6;
      sVar16 = sVar6;
      sVar15 = sVar15 + 1;
    } while (bVar17);
    if (sVar16 == 0x40) {
      sVar16 = 0x3f;
      pcVar9 = &local_aa;
LAB_00102cc3:
      *pcVar9 = L'\0';
    }
    else if (sVar16 == sVar6) {
      pcVar9 = local_128 + sVar16;
      goto LAB_00102cc3;
    }
    if (sVar16 - sVar6 != 0) {
      iVar4 = fseek(__stream,(sVar16 - sVar6) * 2,1);
      if (iVar4 != 0) goto LAB_0010284b;
    }
    pcVar9 = (char16_t *)(undefined1 *)0x0;
    if (local_128[0] != L'\0') {
      pcVar9 = local_128;
    }
  }
  else {
LAB_0010284b:
    pcVar9 = (char16_t *)(undefined1 *)0x0;
  }
  UTF_test(0x68,pcVar9 == local_128);
  pcVar9 = L"あいうえお\n";
  cVar1 = local_128[0];
  while (cVar1 != L'\0') {
    pcVar12 = pcVar12 + 1;
    if (*pcVar9 == L'\0') {
      pcVar9 = L"";
      break;
    }
    if (cVar1 != *pcVar9) {
      bVar17 = false;
      goto LAB_001028f1;
    }
    pcVar9 = pcVar9 + 1;
    cVar1 = *pcVar12;
  }
  bVar17 = cVar1 == *pcVar9;
LAB_001028f1:
  UTF_test(0x69,bVar17);
  if (local_128[0] == L'\0') {
    sVar14 = 1;
  }
  else {
    sVar5 = 1;
    do {
      sVar14 = sVar5 + 1;
      pcVar9 = local_128 + sVar5;
      sVar5 = sVar14;
    } while (*pcVar9 != L'\0');
  }
  UTF_uj16_to_uj8(local_128,sVar14,&local_a8,0x80);
  UVar3 = local_a8;
  if (local_a8 == '\0') {
    pcVar8 = anon_var_dwarf_5af0;
  }
  else {
    pcVar8 = anon_var_dwarf_5af0 + 0x10;
    lVar2 = 0;
    do {
      lVar10 = lVar2;
      if (lVar10 == 0x10) goto LAB_00102979;
      if (UVar3 != anon_var_dwarf_5af0[lVar10]) {
        bVar17 = false;
        goto LAB_00102982;
      }
      UVar3 = aUStack_a7[lVar10];
      lVar2 = lVar10 + 1;
    } while (UVar3 != '\0');
    pcVar8 = anon_var_dwarf_5af0 + lVar10 + 1;
  }
LAB_00102979:
  bVar17 = UVar3 == *pcVar8;
LAB_00102982:
  UTF_test(0x6b,bVar17);
  iVar4 = feof(__stream);
  if (iVar4 == 0) {
    sVar6 = fread(local_128,2,0x40,__stream);
    if (sVar6 == 0) goto LAB_0010299b;
    sVar15 = 1;
    do {
      if (local_128[sVar15 - 1] == L'\n') {
        if ((sVar15 == 1) || (local_128[sVar15 - 2] != L'\r')) {
          if (sVar15 == 0x40) {
            sVar15 = sVar15 - 1;
          }
          local_128[sVar15] = L'\0';
          sVar16 = sVar15;
        }
        else {
          (local_128 + (sVar15 - 2))[0] = L'\n';
          (local_128 + (sVar15 - 2))[1] = L'\0';
          sVar16 = sVar15;
        }
        break;
      }
      bVar17 = sVar15 != sVar6;
      sVar16 = sVar6;
      sVar15 = sVar15 + 1;
    } while (bVar17);
    if (sVar16 == 0x40) {
      sVar16 = 0x3f;
LAB_00102d17:
      local_128[sVar16] = L'\0';
    }
    else if (sVar16 == sVar6) goto LAB_00102d17;
    if (sVar16 - sVar6 != 0) {
      iVar4 = fseek(__stream,(sVar16 - sVar6) * 2,1);
      if (iVar4 != 0) goto LAB_0010299b;
    }
    pcVar9 = local_128;
    if (local_128[0] == L'\0') {
      pcVar9 = (char16_t *)(undefined1 *)0x0;
    }
  }
  else {
LAB_0010299b:
    pcVar9 = (char16_t *)(undefined1 *)0x0;
  }
  UTF_test(0x6d,pcVar9 == local_128);
  pcVar9 = L"漢字\n";
  cVar1 = local_128[0];
  while (cVar1 != L'\0') {
    pcVar13 = pcVar13 + 1;
    if (*pcVar9 == L'\0') {
      pcVar9 = L"";
      break;
    }
    if (cVar1 != *pcVar9) {
      bVar17 = false;
      goto LAB_00102a42;
    }
    pcVar9 = pcVar9 + 1;
    cVar1 = *pcVar13;
  }
  bVar17 = cVar1 == *pcVar9;
LAB_00102a42:
  UTF_test(0x6e,bVar17);
  if (local_128[0] == L'\0') {
    sVar14 = 1;
  }
  else {
    sVar5 = 1;
    do {
      sVar14 = sVar5 + 1;
      pcVar9 = local_128 + sVar5;
      sVar5 = sVar14;
    } while (*pcVar9 != L'\0');
  }
  UTF_uj16_to_uj8(local_128,sVar14,&local_a8,0x80);
  if (local_a8 == '\0') {
    pcVar8 = anon_var_dwarf_5b1c;
  }
  else {
    pcVar8 = anon_var_dwarf_5b1c + 7;
    lVar2 = 0;
    do {
      lVar10 = lVar2;
      if (lVar10 == 7) goto LAB_00102ac7;
      if (local_a8 != anon_var_dwarf_5b1c[lVar10]) {
        bVar17 = false;
        goto LAB_00102ad0;
      }
      local_a8 = aUStack_a7[lVar10];
      lVar2 = lVar10 + 1;
    } while (local_a8 != '\0');
    pcVar8 = anon_var_dwarf_5b1c + lVar10 + 1;
  }
LAB_00102ac7:
  bVar17 = local_a8 == *pcVar8;
LAB_00102ad0:
  UTF_test(0x70,bVar17);
  iVar4 = feof(__stream);
  bVar17 = true;
  if (iVar4 != 0) goto LAB_00102d94;
  sVar6 = fread(local_128,2,0x40,__stream);
  if (sVar6 == 0) goto LAB_00102d94;
  sVar15 = 1;
  do {
    if (local_128[sVar15 - 1] == L'\n') {
      if ((sVar15 == 1) || (local_128[sVar15 - 2] != L'\r')) {
        if (sVar15 == 0x40) {
          sVar15 = sVar15 - 1;
        }
        local_128[sVar15] = L'\0';
        sVar16 = sVar15;
      }
      else {
        (local_128 + (sVar15 - 2))[0] = L'\n';
        (local_128 + (sVar15 - 2))[1] = L'\0';
        sVar16 = sVar15;
      }
      break;
    }
    bVar18 = sVar15 != sVar6;
    sVar16 = sVar6;
    sVar15 = sVar15 + 1;
  } while (bVar18);
  if (sVar16 == 0x40) {
    sVar16 = 0x3f;
LAB_00102d6c:
    local_128[sVar16] = L'\0';
  }
  else if (sVar16 == sVar6) goto LAB_00102d6c;
  if (sVar16 - sVar6 != 0) {
    iVar4 = fseek(__stream,(sVar16 - sVar6) * 2,1);
    if (iVar4 != 0) goto LAB_00102d94;
  }
  bVar17 = local_128[0] == L'\0';
LAB_00102d94:
  UTF_test(0x72,bVar17);
  fclose(__stream);
  return;
}

Assistant:

void UTF_fgets_test(const char *fname)
{
    FILE *fp;
    UTF_UC16 buf[64];
    UTF_C8 buf2[128];

    fp = fopen(fname, "rb");
    if (!fp)
    {
        UTF_test(__LINE__, fp != NULL);
        return;
    }

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("TEST\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, UTF_u8("TEST\n")) == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("ABC123\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, UTF_u8("ABC123\n")) == 0);

    UTF_test(__LINE__, UTF16_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("\u3042\u3044\u3046\u3048\u304A\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, "\xE3\x81\x82\xE3\x81\x84\xE3\x81\x86\xE3\x81\x88\xE3\x81\x8A\n") == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("\u6F22\u5B57\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, "\xE6\xBC\xA2\xE5\xAD\x97\n") == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == NULL);

    fclose(fp);
}